

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

CBString * itemSubtypeToUString(CBString *__return_storage_ptr__,UINT8 type,UINT8 subtype)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0x3d:
    switch(subtype) {
    case 'd':
      s = "Aptio signed";
      break;
    case 'e':
      s = "Aptio unsigned";
      break;
    case 'f':
      s = "UEFI 2.0";
      break;
    case 'g':
      s = "Toshiba";
      break;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 0x3e:
    if (subtype == '[') {
      s = "UEFI";
      break;
    }
    if (subtype != 'Z') goto switchD_00110006_caseD_44;
    goto switchD_00110217_caseD_90;
  case 0x3f:
    regionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 0x40:
    if (subtype == 'z') {
      s = "Non-empty";
    }
    else if (subtype == 'y') {
      s = "Empty (0xFF)";
    }
    else {
      if (subtype != 'x') goto switchD_00110006_caseD_44;
      s = "Empty (0x00)";
    }
    break;
  case 0x41:
    switch(subtype) {
    case 'n':
switchD_00110075_caseD_a1:
      s = "Unknown";
      break;
    case 'o':
      s = "FFSv2";
      break;
    case 'p':
      s = "FFSv3";
      break;
    case 'q':
      s = "NVRAM";
      break;
    case 'r':
      s = "Microcode";
      break;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 0x42:
    fileTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 0x43:
    sectionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  default:
switchD_00110006_caseD_44:
    Bstrlib::CBString::CBString(__return_storage_ptr__);
    return __return_storage_ptr__;
  case 0x4f:
    switch(subtype) {
    case 0x82:
      goto switchD_00110075_caseD_a0;
    case 0x83:
      s = "Invalid link";
      break;
    case 0x84:
      s = "Link";
      break;
    case 0x85:
      goto switchD_00110075_caseD_a4;
    case 0x86:
      s = "Full";
      break;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 0x50:
    switch(subtype) {
    case 0x8c:
      goto switchD_00110075_caseD_a0;
    case 0x8d:
      s = "Standard";
      break;
    case 0x8e:
      s = "Apple";
      break;
    case 0x8f:
      s = "Auth";
      break;
    case 0x90:
      goto switchD_00110217_caseD_90;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 0x51:
    if (subtype == 0x97) {
      s = "Normal";
      break;
    }
    if (subtype != 0x96) goto switchD_00110006_caseD_44;
    goto switchD_00110075_caseD_a0;
  case 0x52:
    switch(subtype) {
    case 0xa0:
      goto switchD_00110075_caseD_a0;
    case 0xa1:
      goto switchD_00110075_caseD_a1;
    case 0xa2:
      s = "GUID";
      break;
    case 0xa3:
      s = "Name";
      break;
    case 0xa4:
      goto switchD_00110075_caseD_a4;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 0x53:
    if (subtype == 0xac) goto switchD_00110075_caseD_a1;
    if (subtype != 0xab) {
      if (subtype == 0xaa) {
        s = "Volume";
        break;
      }
      goto switchD_00110006_caseD_44;
    }
    goto switchD_00110075_caseD_a4;
  case 0x55:
    if (subtype == 0xb5) {
      s = "AMD";
      break;
    }
    if (subtype != 0xb4) goto switchD_00110006_caseD_44;
switchD_00110217_caseD_90:
    s = "Intel";
    break;
  case 0x58:
    if (subtype != 200) {
      if (subtype != 0xc9) goto switchD_00110006_caseD_44;
      s = "Boot";
      break;
    }
    goto switchD_00110075_caseD_a4;
  case 0x5a:
    if (subtype != 0xd3) {
      if (subtype != 0xd2) goto switchD_00110006_caseD_44;
      s = "Valid";
      break;
    }
switchD_00110075_caseD_a0:
    s = "Invalid";
    break;
  case 0x5b:
    if (subtype == 0xde) {
      s = "GLUT";
      break;
    }
    if (subtype != 0xdd) {
      if (subtype != 0xdc) goto switchD_00110006_caseD_44;
      goto switchD_00110251_caseD_e9;
    }
switchD_00110075_caseD_a4:
    s = "Data";
    break;
  case 0x61:
    switch(subtype) {
    case 0xe6:
      s = "Manifest";
      break;
    case 0xe7:
      s = "Metadata";
      break;
    case 0xe8:
      s = "Key";
      break;
    case 0xe9:
switchD_00110251_caseD_e9:
      s = "Code";
      break;
    default:
      goto switchD_00110006_caseD_44;
    }
    break;
  case 100:
    if (subtype != 0xf0) goto switchD_00110006_caseD_44;
    s = "X86 128K";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString itemSubtypeToUString(const UINT8 type, const UINT8 subtype)
{
    switch (type) {
        case Types::Image:
            if      (subtype == Subtypes::IntelImage)                   return UString("Intel");
            else if (subtype == Subtypes::UefiImage)                    return UString("UEFI");
            break;
        case Types::Padding:
            if      (subtype == Subtypes::ZeroPadding)                  return UString("Empty (0x00)");
            else if (subtype == Subtypes::OnePadding)                   return UString("Empty (0xFF)");
            else if (subtype == Subtypes::DataPadding)                  return UString("Non-empty");
            break;
        case Types::Volume:
            if      (subtype == Subtypes::UnknownVolume)                return UString("Unknown");
            else if (subtype == Subtypes::Ffs2Volume)                   return UString("FFSv2");
            else if (subtype == Subtypes::Ffs3Volume)                   return UString("FFSv3");
            else if (subtype == Subtypes::NvramVolume)                  return UString("NVRAM");
            else if (subtype == Subtypes::MicrocodeVolume)              return UString("Microcode");
            break;
        case Types::Capsule:
            if      (subtype == Subtypes::AptioSignedCapsule)           return UString("Aptio signed");
            else if (subtype == Subtypes::AptioUnsignedCapsule)         return UString("Aptio unsigned");
            else if (subtype == Subtypes::UefiCapsule)                  return UString("UEFI 2.0");
            else if (subtype == Subtypes::ToshibaCapsule)               return UString("Toshiba");
            break;
        case Types::Region:                                             return regionTypeToUString(subtype);
        case Types::File:                                               return fileTypeToUString(subtype);
        case Types::Section:                                            return sectionTypeToUString(subtype);
        case Types::NvarEntry:
            if      (subtype == Subtypes::InvalidNvarEntry)             return UString("Invalid");
            else if (subtype == Subtypes::InvalidLinkNvarEntry)         return UString("Invalid link");
            else if (subtype == Subtypes::LinkNvarEntry)                return UString("Link");
            else if (subtype == Subtypes::DataNvarEntry)                return UString("Data");
            else if (subtype == Subtypes::FullNvarEntry)                return UString("Full");
            break;
        case Types::VssEntry:
            if      (subtype == Subtypes::InvalidVssEntry)              return UString("Invalid");
            else if (subtype == Subtypes::StandardVssEntry)             return UString("Standard");
            else if (subtype == Subtypes::AppleVssEntry)                return UString("Apple");
            else if (subtype == Subtypes::AuthVssEntry)                 return UString("Auth");
            else if (subtype == Subtypes::IntelVssEntry)                return UString("Intel");
            break;
        case Types::SysFEntry:
            if      (subtype == Subtypes::InvalidSysFEntry)             return UString("Invalid");
            else if (subtype == Subtypes::NormalSysFEntry)              return UString("Normal");
            break;
        case Types::EvsaEntry:
            if      (subtype == Subtypes::InvalidEvsaEntry)             return UString("Invalid");
            else if (subtype == Subtypes::UnknownEvsaEntry)             return UString("Unknown");
            else if (subtype == Subtypes::GuidEvsaEntry)                return UString("GUID");
            else if (subtype == Subtypes::NameEvsaEntry)                return UString("Name");
            else if (subtype == Subtypes::DataEvsaEntry)                return UString("Data");
            break;
        case Types::PhoenixFlashMapEntry:
            if      (subtype == Subtypes::VolumeFlashMapEntry)          return UString("Volume");
            else if (subtype == Subtypes::DataFlashMapEntry)            return UString("Data");
            else if (subtype == Subtypes::UnknownFlashMapEntry)         return UString("Unknown");
            break;
        case Types::Microcode:
            if      (subtype == Subtypes::IntelMicrocode)               return UString("Intel");
            else if (subtype == Subtypes::AmdMicrocode)                 return UString("AMD");
            break;
        case Types::FptEntry:
            if      (subtype == Subtypes::ValidFptEntry)                return UString("Valid");
            else if (subtype == Subtypes::InvalidFptEntry)              return UString("Invalid");
            break;
        case Types::FptPartition:
            if      (subtype == Subtypes::CodeFptPartition)             return UString("Code");
            else if (subtype == Subtypes::DataFptPartition)             return UString("Data");
            else if (subtype == Subtypes::GlutFptPartition)             return UString("GLUT");
            break;
        case Types::IfwiPartition:
            if      (subtype == Subtypes::BootIfwiPartition)            return UString("Boot");
            else if (subtype == Subtypes::DataIfwiPartition)            return UString("Data");
            break;
        case Types::CpdPartition:
            if      (subtype == Subtypes::ManifestCpdPartition)         return UString("Manifest");
            else if (subtype == Subtypes::MetadataCpdPartition)         return UString("Metadata");
            else if (subtype == Subtypes::KeyCpdPartition)              return UString("Key");
            else if (subtype == Subtypes::CodeCpdPartition)             return UString("Code");
            break;
        case Types::StartupApDataEntry:
            if      (subtype == Subtypes::x86128kStartupApDataEntry)    return UString("X86 128K");
            break;
    }
    
    return UString();
}